

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O2

void __thiscall
gvr::TexturedMesh::savePLY(TexturedMesh *this,char *plyname,bool all,ply_encoding enc)

{
  uint __fd;
  ostream *poVar1;
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_00;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_01;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_02;
  void *pvVar2;
  void *__buf_08;
  void *extraout_RDX_03;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  string *name;
  int i;
  long lVar3;
  long lVar4;
  allocator local_409;
  string local_408;
  PLYWriter ply;
  ostringstream out;
  
  PLYWriter::PLYWriter(&ply);
  PLYWriter::open(&ply,plyname,enc);
  Model::setOriginToPLY((Model *)this,&ply);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  poVar1 = std::operator<<((ostream *)&out,"TextureFile ");
  std::operator<<(poVar1,(string *)&this->name);
  std::__cxx11::stringbuf::str();
  PLYWriter::addComment(&ply,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"vertex",&local_409);
  PLYWriter::addElement(&ply,&local_408,(long)(this->super_Mesh).super_PointCloud.n);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"x",&local_409);
  PLYWriter::addProperty(&ply,&local_408,ply_float32);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"y",&local_409);
  PLYWriter::addProperty(&ply,&local_408,ply_float32);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"z",&local_409);
  PLYWriter::addProperty(&ply,&local_408,ply_float32);
  std::__cxx11::string::~string((string *)&local_408);
  if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
    if (!all) goto LAB_00121a91;
  }
  else {
    std::__cxx11::string::string((string *)&local_408,"scan_size",&local_409);
    PLYWriter::addProperty(&ply,&local_408,ply_float32);
    std::__cxx11::string::~string((string *)&local_408);
    if (!all) goto LAB_00121a91;
    std::__cxx11::string::string((string *)&local_408,"scan_error",&local_409);
    PLYWriter::addProperty(&ply,&local_408,ply_float32);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::string((string *)&local_408,"scan_conf",&local_409);
    PLYWriter::addProperty(&ply,&local_408,ply_float32);
    std::__cxx11::string::~string((string *)&local_408);
  }
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&local_408,"sx",&local_409);
    PLYWriter::addProperty(&ply,&local_408,ply_float32);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::string((string *)&local_408,"sy",&local_409);
    PLYWriter::addProperty(&ply,&local_408,ply_float32);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::string((string *)&local_408,"sz",&local_409);
    PLYWriter::addProperty(&ply,&local_408,ply_float32);
    std::__cxx11::string::~string((string *)&local_408);
  }
  std::__cxx11::string::string((string *)&local_408,"nx",&local_409);
  PLYWriter::addProperty(&ply,&local_408,ply_float32);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"ny",&local_409);
  PLYWriter::addProperty(&ply,&local_408,ply_float32);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"nz",&local_409);
  PLYWriter::addProperty(&ply,&local_408,ply_float32);
  std::__cxx11::string::~string((string *)&local_408);
LAB_00121a91:
  std::__cxx11::string::string((string *)&local_408,"u",&local_409);
  PLYWriter::addProperty(&ply,&local_408,ply_float32);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"v",&local_409);
  PLYWriter::addProperty(&ply,&local_408,ply_float32);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"face",&local_409);
  PLYWriter::addElement(&ply,&local_408,(long)(this->super_Mesh).n);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_408,"vertex_indices",&local_409);
  name = &local_408;
  __n = 6;
  PLYWriter::addProperty(&ply,name,ply_uint8,ply_uint32);
  std::__cxx11::string::~string((string *)&local_408);
  lVar3 = 0;
  pvVar2 = extraout_RDX;
  do {
    if ((this->super_Mesh).super_PointCloud.n <= lVar3) {
      lVar4 = 0;
      for (lVar3 = 0; lVar3 < (this->super_Mesh).n; lVar3 = lVar3 + 1) {
        PLYWriter::writeListSize(&ply,3);
        PLYWriter::write(&ply,*(int *)((long)(this->super_Mesh).triangle + lVar4),__buf_09,__n);
        PLYWriter::write(&ply,*(int *)((long)(this->super_Mesh).triangle + lVar4 + 4),__buf_10,__n);
        __fd = *(uint *)((long)(this->super_Mesh).triangle + lVar4 + 8);
        name = (string *)(ulong)__fd;
        PLYWriter::write(&ply,__fd,__buf_11,__n);
        lVar4 = lVar4 + 0xc;
      }
      PLYWriter::close(&ply,(int)name);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
      PLYWriter::~PLYWriter(&ply);
      return;
    }
    PLYWriter::write(&ply,(int)name,pvVar2,__n);
    PLYWriter::write(&ply,(int)name,__buf,__n);
    PLYWriter::write(&ply,(int)name,__buf_00,__n);
    if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
      pvVar2 = __buf_01;
      if (all) goto LAB_00121c16;
    }
    else {
      PLYWriter::write(&ply,(int)name,__buf_01,__n);
      pvVar2 = __buf_02;
      if (all) {
        PLYWriter::write(&ply,(int)name,__buf_02,__n);
        PLYWriter::write(&ply,(int)name,__buf_03,__n);
        pvVar2 = extraout_RDX_00;
LAB_00121c16:
        if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
          PLYWriter::write(&ply,(int)name,pvVar2,__n);
          PLYWriter::write(&ply,(int)name,__buf_04,__n);
          PLYWriter::write(&ply,(int)name,__buf_05,__n);
          pvVar2 = extraout_RDX_01;
        }
        PLYWriter::write(&ply,(int)name,pvVar2,__n);
        PLYWriter::write(&ply,(int)name,__buf_06,__n);
        PLYWriter::write(&ply,(int)name,__buf_07,__n);
        pvVar2 = extraout_RDX_02;
      }
    }
    PLYWriter::write(&ply,(int)name,pvVar2,__n);
    PLYWriter::write(&ply,(int)name,__buf_08,__n);
    lVar3 = lVar3 + 1;
    pvVar2 = extraout_RDX_03;
  } while( true );
}

Assistant:

void TexturedMesh::savePLY(const char *plyname, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(plyname, enc);

  // define data

  setOriginToPLY(ply);

  std::ostringstream out;
  out << "TextureFile " << name;
  ply.addComment(out.str());

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addProperty("u", ply_float32);
  ply.addProperty("v", ply_float32);

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }

    ply.write(getTextureCoordComp(i, 0));
    ply.write(getTextureCoordComp(i, 1));
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));
  }

  ply.close();
}